

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O0

void __thiscall ICOReader::read8BitBMP(ICOReader *this,QImage *image)

{
  char *pcVar1;
  QImage *this_00;
  longlong lVar2;
  QImage *pQVar3;
  int in_ESI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  qsizetype bpl;
  int h;
  QImage *in_stack_ffffffffffffffa8;
  int local_4c;
  QImage local_38 [24];
  QImage local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x18) == 0) {
    QImage::QImage(local_38);
    QImage::operator=(in_stack_ffffffffffffffa8,in_RDI);
    QImage::~QImage(local_38);
  }
  else {
    local_4c = *(int *)(in_RDI + 8);
    this_00 = (QImage *)QImage::bytesPerLine();
    do {
      local_4c = local_4c + -1;
      if (local_4c < 0) goto LAB_00105a8f;
      pcVar1 = *(char **)(in_RDI + 0x18);
      lVar2 = QImage::scanLine(in_ESI);
      pQVar3 = (QImage *)QIODevice::read(pcVar1,lVar2);
    } while (pQVar3 == this_00);
    QImage::QImage(local_20);
    QImage::operator=(this_00,in_RDI);
    QImage::~QImage(local_20);
  }
LAB_00105a8f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ICOReader::read8BitBMP(QImage & image)
{
    if (iod) {

        int h = icoAttrib.h;
        qsizetype bpl = image.bytesPerLine();

        while (--h >= 0) {
            if (iod->read((char *)image.scanLine(h), bpl) != bpl) {
                image = QImage();
                break;
            }
        }
    } else {
        image = QImage();
    }
}